

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_showref.cpp
# Opt level: O1

BaseTableColumnInfo __thiscall
duckdb::FindBaseTableColumn(duckdb *this,LogicalOperator *op,ColumnBinding binding)

{
  BaseTableColumnInfo BVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  type pLVar4;
  LogicalGet *this_00;
  vector<duckdb::ColumnIndex,_true> *this_01;
  const_reference pvVar5;
  LogicalProjection *pLVar6;
  reference this_02;
  pointer pEVar7;
  BoundColumnRefExpression *pBVar8;
  reference this_03;
  InternalException *this_04;
  idx_t iVar9;
  optional_ptr<duckdb::TableCatalogEntry,_true> oVar10;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *this_05;
  optional_ptr<const_duckdb::ColumnDefinition,_true> oVar11;
  TableCatalogEntry *unaff_R15;
  bool bVar12;
  bool bVar13;
  BaseTableColumnInfo BVar14;
  BaseTableColumnInfo BVar15;
  ColumnBinding binding_00;
  ColumnBinding binding_01;
  ColumnBinding binding_02;
  optional_ptr<duckdb::TableCatalogEntry,_true> table;
  value_type base_column_id;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_70;
  LogicalOperator *local_68;
  TableCatalogEntry *local_60;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_58;
  undefined1 local_50 [16];
  char local_40 [16];
  
  binding_00.table_index = (TableCatalogEntry *)binding.table_index;
  uVar3 = (ulong)(byte)this[8];
  if (uVar3 < 0x39) {
    iVar9 = 0x1740000000019c4;
    if ((0x1740000000019c4U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 == 1) {
        pLVar6 = LogicalOperator::Cast<duckdb::LogicalProjection>((LogicalOperator *)this);
        if ((LogicalOperator *)pLVar6->table_index == op) {
          this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](&(pLVar6->super_LogicalOperator).expressions,
                                 (size_type)binding_00.table_index);
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_02);
          bVar12 = (pEVar7->super_BaseExpression).type != BOUND_COLUMN_REF;
          if (!bVar12) {
            pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(this_02);
            pBVar8 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                               (&pEVar7->super_BaseExpression);
            bVar12 = false;
            this_03 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](&(pLVar6->super_LogicalOperator).children,0);
            pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     ::operator*(this_03);
            binding_02.column_index = iVar9;
            binding_02.table_index = (pBVar8->binding).column_index;
            BVar14 = FindBaseTableColumn((duckdb *)pLVar4,
                                         (LogicalOperator *)(pBVar8->binding).table_index,binding_02
                                        );
            op = (LogicalOperator *)BVar14.column.ptr;
            binding_00.table_index = BVar14.table.ptr;
          }
        }
        else {
          bVar12 = true;
        }
        if (!bVar12) goto LAB_01205ff9;
        goto LAB_01206158;
      }
      oVar10.ptr = (TableCatalogEntry *)0x0;
      oVar11.ptr = (ColumnDefinition *)0x0;
      if (uVar3 == 0x19) {
        this_00 = LogicalOperator::Cast<duckdb::LogicalGet>((LogicalOperator *)this);
        if ((LogicalOperator *)this_00->table_index == op) {
          oVar10 = LogicalGet::GetTable(this_00);
          bVar12 = oVar10.ptr == (TableCatalogEntry *)0x0;
          if (bVar12) {
            oVar11.ptr = (ColumnDefinition *)0x0;
            oVar10.ptr = (TableCatalogEntry *)0x0;
          }
          else {
            local_70 = oVar10;
            if ((this_00->projection_ids).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (this_00->projection_ids).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              this_04 = (InternalException *)__cxa_allocate_exception(0x10);
              local_50._0_8_ = local_40;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_50,"Projection ids should not exist here","");
              InternalException::InternalException(this_04,(string *)local_50);
              __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            this_01 = LogicalGet::GetColumnIds(this_00);
            pvVar5 = vector<duckdb::ColumnIndex,_true>::operator[]
                               (this_01,(size_type)binding_00.table_index);
            local_50._0_8_ = pvVar5->index;
            ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::vector
                      ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                       (local_50 + 8),
                       &(pvVar5->child_indexes).
                        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
            optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_70);
            op = (LogicalOperator *)
                 TableCatalogEntry::GetColumn(local_70.ptr,(LogicalIndex)local_50._0_8_);
            ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                      ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                       (local_50 + 8));
            oVar11.ptr = (ColumnDefinition *)op;
            binding_00.table_index = oVar10;
          }
        }
        else {
          oVar11.ptr = (ColumnDefinition *)0x0;
          oVar10.ptr = (TableCatalogEntry *)0x0;
          bVar12 = false;
          binding_00.table_index = (TableCatalogEntry *)0x0;
          op = (LogicalOperator *)0x0;
        }
        BVar14.column.ptr = (ColumnDefinition *)op;
        BVar14.table.ptr = oVar10.ptr;
        goto joined_r0x01206167;
      }
    }
    else {
      this_05 = *(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  **)(this + 0x10);
      local_58 = *(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   **)(this + 0x18);
      bVar12 = this_05 == local_58;
      if (bVar12) {
        oVar11.ptr = (ColumnDefinition *)0x0;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = op;
        BVar14 = (BaseTableColumnInfo)(auVar2 << 0x40);
        binding_00.table_index = unaff_R15;
      }
      else {
        pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator*(this_05);
        binding_00.column_index = iVar9;
        BVar14 = FindBaseTableColumn((duckdb *)pLVar4,op,binding_00);
        bVar13 = BVar14.table.ptr.ptr == (TableCatalogEntry *)0x0;
        local_68 = op;
        BVar1 = BVar14;
        local_60 = binding_00.table_index;
        while( true ) {
          oVar11 = BVar1.column.ptr;
          binding_00.table_index = BVar1.table.ptr;
          if (!bVar13) break;
          this_05 = this_05 + 1;
          bVar12 = this_05 == local_58;
          if (bVar12) break;
          pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   ::operator*(this_05);
          binding_01.column_index = iVar9;
          binding_01.table_index = (idx_t)local_60;
          BVar15 = FindBaseTableColumn((duckdb *)pLVar4,local_68,binding_01);
          oVar10 = BVar15.table.ptr;
          bVar13 = oVar10.ptr == (TableCatalogEntry *)0x0;
          if (!bVar13) {
            binding_00.table_index = oVar10.ptr;
          }
          BVar1.column.ptr = BVar15.column.ptr.ptr;
          BVar1.table.ptr = binding_00.table_index;
          oVar11.ptr = BVar14.column.ptr.ptr;
          if (!bVar13) {
            oVar11.ptr = BVar15.column.ptr.ptr;
          }
          BVar14.column.ptr = oVar11.ptr;
          BVar14.table.ptr = oVar10.ptr;
        }
      }
joined_r0x01206167:
      op = (LogicalOperator *)BVar14.column.ptr;
      oVar10 = BVar14.table.ptr;
      if (!bVar12) goto LAB_01205ff9;
    }
  }
  else {
LAB_01206158:
    oVar10.ptr = (TableCatalogEntry *)0x0;
    oVar11.ptr = (ColumnDefinition *)0x0;
  }
  op = (LogicalOperator *)oVar11.ptr;
  binding_00.table_index = oVar10.ptr;
LAB_01205ff9:
  BVar15.column.ptr = (ColumnDefinition *)op;
  BVar15.table.ptr = binding_00.table_index;
  return BVar15;
}

Assistant:

BaseTableColumnInfo FindBaseTableColumn(LogicalOperator &op, ColumnBinding binding) {
	BaseTableColumnInfo result;
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_GET: {
		auto &get = op.Cast<LogicalGet>();
		if (get.table_index != binding.table_index) {
			return result;
		}
		auto table = get.GetTable();
		if (!table) {
			break;
		}
		if (!get.projection_ids.empty()) {
			throw InternalException("Projection ids should not exist here");
		}
		result.table = table;
		auto base_column_id = get.GetColumnIds()[binding.column_index];
		result.column = &table->GetColumn(LogicalIndex(base_column_id.GetPrimaryIndex()));
		return result;
	}
	case LogicalOperatorType::LOGICAL_PROJECTION: {
		auto &projection = op.Cast<LogicalProjection>();
		if (binding.table_index != projection.table_index) {
			break;
		}
		auto &expr = projection.expressions[binding.column_index];
		if (expr->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
			// if the projection at this index only has a column reference we can directly trace it to the base table
			auto &bound_colref = expr->Cast<BoundColumnRefExpression>();
			return FindBaseTableColumn(*projection.children[0], bound_colref.binding);
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_LIMIT:
	case LogicalOperatorType::LOGICAL_ORDER_BY:
	case LogicalOperatorType::LOGICAL_TOP_N:
	case LogicalOperatorType::LOGICAL_SAMPLE:
	case LogicalOperatorType::LOGICAL_DISTINCT:
	case LogicalOperatorType::LOGICAL_FILTER:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_JOIN:
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
		// for any "pass-through" operators - search in children directly
		for (auto &child : op.children) {
			result = FindBaseTableColumn(*child, binding);
			if (result.table) {
				return result;
			}
		}
		break;
	default:
		// unsupported operator
		break;
	}
	return result;
}